

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Buffer::consume(Buffer *this,size_t consumedBytes)

{
  char *pcVar1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __last;
  pointer pcVar2;
  allocator_type local_29;
  pointer local_28;
  pointer pcStack_20;
  pointer local_18;
  
  pcVar1 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __last._M_current =
       (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if ((ulong)((long)__last._M_current - (long)pcVar1) < consumedBytes) {
    if (__last._M_current != pcVar1) {
      (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar1;
    }
  }
  else {
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((vector<char,std::allocator<char>> *)&local_28,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pcVar1 + consumedBytes),__last,&local_29);
    pcVar2 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = local_28;
    (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcStack_20;
    (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_18;
    local_28 = (pointer)0x0;
    pcStack_20 = (pointer)0x0;
    local_18 = (pointer)0x0;
    if (pcVar2 != (pointer)0x0) {
      operator_delete(pcVar2);
      if (local_28 != (pointer)0x0) {
        operator_delete(local_28);
      }
    }
  }
  return;
}

Assistant:

void Buffer::consume(std::size_t consumedBytes) {
    if(consumedBytes > data.size()){
        data.clear();
    }
    else{
        data = std::vector<char>(data.begin() + consumedBytes, data.end());
    }
}